

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

ParamGenerator<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
 __thiscall
testing::internal::CartesianProductHolder::operator_cast_to_ParamGenerator
          (CartesianProductHolder *this)

{
  ParamGeneratorInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Tuple_impl<0UL,_testing::internal::ValueArray<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
  *in_RSI;
  ParamGenerator<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  PVar2;
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
  local_40;
  
  __p = (ParamGeneratorInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
         *)operator_new(0x28);
  std::
  _Tuple_impl<0ul,testing::internal::ParamGenerator<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int)>,testing::internal::ParamGenerator<BLOCK_SIZE>>
  ::
  _Tuple_impl<testing::internal::ValueArray<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int)>,testing::internal::ParamGenerator<BLOCK_SIZE>>
            ((_Tuple_impl<0ul,testing::internal::ParamGenerator<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int)>,testing::internal::ParamGenerator<BLOCK_SIZE>>
              *)&local_40,in_RSI);
  __p->_vptr_ParamGeneratorInterface = (_func_int **)&PTR__CartesianProductGenerator_01098128;
  std::
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
                 *)(__p + 1),&local_40);
  *(ParamGeneratorInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
    **)this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::internal::ParamGeneratorInterface<std::tuple<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
  _Var1._M_pi = extraout_RDX;
  if (local_40.
      super__Head_base<0UL,_testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_false>
      ._M_head_impl.impl_.
      super___shared_ptr<const_testing::internal::ParamGeneratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super__Head_base<0UL,_testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_false>
               ._M_head_impl.impl_.
               super___shared_ptr<const_testing::internal::ParamGeneratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_40.super__Tuple_impl<1UL,_testing::internal::ParamGenerator<BLOCK_SIZE>_>.
      super__Head_base<1UL,_testing::internal::ParamGenerator<BLOCK_SIZE>,_false>._M_head_impl.impl_
      .
      super___shared_ptr<const_testing::internal::ParamGeneratorInterface<BLOCK_SIZE>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super__Tuple_impl<1UL,_testing::internal::ParamGenerator<BLOCK_SIZE>_>.
               super__Head_base<1UL,_testing::internal::ParamGenerator<BLOCK_SIZE>,_false>.
               _M_head_impl.impl_.
               super___shared_ptr<const_testing::internal::ParamGeneratorInterface<BLOCK_SIZE>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
          )PVar2.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<::std::tuple<T...>>() const {
    return ParamGenerator<::std::tuple<T...>>(
        new CartesianProductGenerator<T...>(generators_));
  }